

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::Dice(Dice *this)

{
  time_t tVar1;
  DiceEffectsObserver *this_00;
  long lVar2;
  initializer_list<std::pair<const_Dice::DiceOptions,_int>_> __l;
  initializer_list<std::pair<const_Dice::DiceOptions,_int>_> __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
  __l_01;
  allocator_type local_15e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_15d;
  DiceOptions local_15c;
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  historyOfRolls;
  DiceOptions local_138 [4];
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  DiceValues;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_60;
  
  Subject::Subject(&this->super_Subject);
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_001218d0;
  this->DiceNames[0] = "Energy";
  this->DiceNames[1] = "Attack";
  this->DiceNames[2] = "Destruction";
  this->DiceNames[3] = "Heal";
  this->DiceNames[4] = "Celebrity";
  this->DiceNames[5] = "Ouch";
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x4;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 5;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x2;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x3;
  DiceValues._M_t._M_impl._0_8_ = 0;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __l._M_len = 6;
  __l._M_array = (iterator)&DiceValues;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&this->DiceValues,__l,(less<Dice::DiceOptions> *)&historyOfRolls,
        (allocator_type *)&local_15c);
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x4;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 5;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x2;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x3;
  DiceValues._M_t._M_impl._0_8_ = 0;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&DiceValues;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&this->resolvedHand,__l_00,(less<Dice::DiceOptions> *)&historyOfRolls,
        (allocator_type *)&local_15c);
  this->totalDiceValues[0] = 0;
  this->totalDiceValues[1] = 0;
  this->totalDiceValues[2] = 0;
  this->totalDiceValues[3] = 0;
  (this->historyOfRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->it)._M_current =
       (map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
        *)0x0;
  (this->historyOfRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->historyOfRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->totalDiceValues[4] = 0;
  this->totalDiceValues[5] = 0;
  (this->historyOfResolvedRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->historyOfResolvedRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mapIt)._M_node = (_Base_ptr)0x0;
  (this->historyOfResolvedRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  historyOfRolls.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(historyOfRolls.
                         super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
              *)&DiceValues,(char (*) [2])"A",(DiceOptions *)&historyOfRolls);
  local_15c = Energy;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
              *)&DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count,(char (*) [2])0x11524d,
             &local_15c);
  local_138[3] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(&local_d8,(char (*) [2])"D",local_138 + 3);
  local_138[2] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(&local_b0,(char (*) [2])"H",local_138 + 2);
  local_138[1] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(&local_88,(char (*) [2])"C",local_138 + 1);
  local_138[0] = Ouch;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(&local_60,(char (*) [2])0x1150da,local_138);
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)&DiceValues;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
  ::map(&this->diceMap,__l_01,&local_15d,&local_15e);
  lVar2 = 200;
  do {
    std::__cxx11::string::~string((string *)(&DiceValues._M_t._M_impl.field_0x0 + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this->numberOfRolls = 3;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &DiceValues._M_t._M_impl.super__Rb_tree_header._M_header;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  historyOfRolls.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  historyOfRolls.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  historyOfRolls.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = (DiceEffectsObserver *)operator_new(0x10);
  DiceEffectsObserver::DiceEffectsObserver(this_00,&this->super_Subject);
  (**(this->super_Subject)._vptr_Subject)(this,this_00);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::~vector(&historyOfRolls);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&DiceValues._M_t);
  return;
}

Assistant:

Dice::Dice() {
    srand((unsigned)time(0));
    numberOfRolls = 3;

    map<DiceOptions, int> DiceValues;
    vector< map < DiceOptions, int> > historyOfRolls;

    vector< map < DiceOptions, int> > ::iterator it;

    // Attach the observer
    attach(new DiceEffectsObserver(this));

}